

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# passes.hpp
# Opt level: O0

TupleAccess * __thiscall
Pass1::create<TupleAccess,Expression_const*&,unsigned_long_const&,Type_const*&>
          (Pass1 *this,Expression **arguments,unsigned_long *arguments_1,Type **arguments_2)

{
  TupleAccess *this_00;
  TupleAccess *expression;
  Type **arguments_local_2;
  unsigned_long *arguments_local_1;
  Expression **arguments_local;
  Pass1 *this_local;
  
  this_00 = (TupleAccess *)operator_new(0x30);
  TupleAccess::TupleAccess(this_00,*arguments,*arguments_1,*arguments_2);
  Block::add_expression(this->destination_block,(Expression *)this_00);
  return this_00;
}

Assistant:

T* create(A&&... arguments) {
		T* expression = new T(std::forward<A>(arguments)...);
		destination_block->add_expression(expression);
		return expression;
	}